

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  int *count;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6dc;
  undefined1 in_stack_fffffffffffff6dd;
  undefined1 in_stack_fffffffffffff6de;
  undefined1 in_stack_fffffffffffff6df;
  undefined1 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e1;
  undefined1 in_stack_fffffffffffff6e2;
  undefined1 in_stack_fffffffffffff6e3;
  undefined1 in_stack_fffffffffffff6e4;
  undefined1 in_stack_fffffffffffff6e5;
  undefined1 in_stack_fffffffffffff6e6;
  undefined1 in_stack_fffffffffffff6e7;
  undefined4 in_stack_fffffffffffff6f0;
  uint i_00;
  int line;
  Hasher *this_00;
  Hasher *this_01;
  Type type;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  *this_02;
  string local_8e8 [40];
  undefined4 in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  undefined7 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74f;
  char *in_stack_fffffffffffff750;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffff758;
  AssertHelper *in_stack_fffffffffffff760;
  int local_804;
  value_type *in_stack_fffffffffffff818;
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff820;
  int local_764;
  string local_760 [55];
  undefined1 local_729;
  AssertionResult local_728 [10];
  string local_680 [55];
  byte local_649;
  AssertionResult local_648;
  string local_638 [55];
  undefined1 local_601;
  AssertionResult local_600 [10];
  string local_558 [55];
  byte local_521;
  AssertionResult local_520;
  string local_510 [55];
  undefined1 local_4d9;
  AssertionResult local_4d8 [12];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_410;
  Hasher local_3fc;
  string local_3f0 [55];
  undefined1 local_3b9;
  AssertionResult local_3b8;
  string local_3a8 [55];
  byte local_371;
  AssertionResult local_370;
  string local_360 [55];
  undefined1 local_329;
  AssertionResult local_328;
  string local_318 [32];
  string local_2f8 [55];
  byte local_2c1;
  AssertionResult local_2c0;
  string local_2b0 [55];
  undefined1 local_279;
  AssertionResult local_278;
  string local_268 [55];
  byte local_231;
  AssertionResult local_230;
  string local_220 [55];
  undefined1 local_1e9;
  AssertionResult local_1e8;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_1d8;
  Hasher local_1c8;
  Hasher local_1bc [17];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_e8;
  Hasher local_d8;
  Hasher local_cc [17];
  
  this_00 = local_cc;
  i_00 = 0;
  Hasher::Hasher(this_00,0);
  this_01 = &local_d8;
  Hasher::Hasher(this_01,i_00);
  count = (int *)(ulong)i_00;
  this_02 = &local_e8;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(this_02,i_00,count);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_00,(size_type)count,(hasher *)CONCAT44(i_00,in_stack_fffffffffffff6f0),
             (key_equal *)in_RDI,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff6e7,
                      CONCAT16(in_stack_fffffffffffff6e6,
                               CONCAT15(in_stack_fffffffffffff6e5,
                                        CONCAT14(in_stack_fffffffffffff6e4,
                                                 CONCAT13(in_stack_fffffffffffff6e3,
                                                          CONCAT12(in_stack_fffffffffffff6e2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff6e1,
                                                  in_stack_fffffffffffff6e0))))))));
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_e8);
  Hasher::Hasher(local_1bc,0);
  Hasher::Hasher(&local_1c8,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_1d8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_00,(size_type)count,(hasher *)CONCAT44(i_00,in_stack_fffffffffffff6f0),
             (key_equal *)in_RDI,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff6e7,
                      CONCAT16(in_stack_fffffffffffff6e6,
                               CONCAT15(in_stack_fffffffffffff6e5,
                                        CONCAT14(in_stack_fffffffffffff6e4,
                                                 CONCAT13(in_stack_fffffffffffff6e3,
                                                          CONCAT12(in_stack_fffffffffffff6e2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff6e1,
                                                  in_stack_fffffffffffff6e0))))))));
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_1d8);
  uVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6e7,
                                   CONCAT16(in_stack_fffffffffffff6e6,
                                            CONCAT15(in_stack_fffffffffffff6e5,
                                                     CONCAT14(in_stack_fffffffffffff6e4,
                                                              CONCAT13(in_stack_fffffffffffff6e3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff6e2,
                                                  CONCAT11(in_stack_fffffffffffff6e1,
                                                           in_stack_fffffffffffff6e0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,
                                   CONCAT16(in_stack_fffffffffffff6de,
                                            CONCAT15(in_stack_fffffffffffff6dd,
                                                     CONCAT14(in_stack_fffffffffffff6dc,
                                                              in_stack_fffffffffffff6d8)))));
  local_1e9 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff6e6,
                                     CONCAT15(in_stack_fffffffffffff6e5,
                                              CONCAT14(in_stack_fffffffffffff6e4,
                                                       CONCAT13(in_stack_fffffffffffff6e3,
                                                                CONCAT12(in_stack_fffffffffffff6e2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff6e1,
                                                  in_stack_fffffffffffff6e0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeec9a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff6e6,
                                       CONCAT15(in_stack_fffffffffffff6e5,
                                                CONCAT14(in_stack_fffffffffffff6e4,
                                                         CONCAT13(in_stack_fffffffffffff6e3,
                                                                  CONCAT12(in_stack_fffffffffffff6e2
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff6e1,
                                                  in_stack_fffffffffffff6e0))))))));
    std::__cxx11::string::~string(local_220);
    testing::Message::~Message((Message *)0xeecae4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeecb78);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff6e6,
                                                  CONCAT15(in_stack_fffffffffffff6e5,
                                                           CONCAT14(in_stack_fffffffffffff6e4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
                       ,(BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6df,
                                    CONCAT16(in_stack_fffffffffffff6de,
                                             CONCAT15(in_stack_fffffffffffff6dd,
                                                      CONCAT14(in_stack_fffffffffffff6dc,
                                                               in_stack_fffffffffffff6d8)))));
  local_231 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff6e5,
                                                    CONCAT14(in_stack_fffffffffffff6e4,
                                                             CONCAT13(in_stack_fffffffffffff6e3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff6e2,
                                                  CONCAT11(in_stack_fffffffffffff6e1,
                                                           in_stack_fffffffffffff6e0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeecbb6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff6e5,
                                                      CONCAT14(in_stack_fffffffffffff6e4,
                                                               CONCAT13(in_stack_fffffffffffff6e3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff6e2,
                                                  CONCAT11(in_stack_fffffffffffff6e1,
                                                           in_stack_fffffffffffff6e0))))))));
    std::__cxx11::string::~string(local_268);
    testing::Message::~Message((Message *)0xeecc8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeecd1f);
  uVar4 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff6e5,
                                                                 CONCAT14(in_stack_fffffffffffff6e4,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
                       ,(BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6df,
                                    CONCAT16(in_stack_fffffffffffff6de,
                                             CONCAT15(in_stack_fffffffffffff6dd,
                                                      CONCAT14(in_stack_fffffffffffff6dc,
                                                               in_stack_fffffffffffff6d8)))));
  local_279 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff6e4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff6df,
                               CONCAT16(in_stack_fffffffffffff6de,
                                        CONCAT15(in_stack_fffffffffffff6dd,
                                                 CONCAT14(in_stack_fffffffffffff6dc,
                                                          in_stack_fffffffffffff6d8)))),
             (type *)0xeecd60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff6e4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
              );
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xeece35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeecec9);
  uVar5 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff6e4,
                                                  CONCAT13(in_stack_fffffffffffff6e3,
                                                           CONCAT12(in_stack_fffffffffffff6e2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffff6e1,
                                                  in_stack_fffffffffffff6e0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,
                                   CONCAT16(in_stack_fffffffffffff6de,
                                            CONCAT15(in_stack_fffffffffffff6dd,
                                                     CONCAT14(in_stack_fffffffffffff6dc,
                                                              in_stack_fffffffffffff6d8)))));
  local_2c1 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff6df,
                               CONCAT16(in_stack_fffffffffffff6de,
                                        CONCAT15(in_stack_fffffffffffff6dd,
                                                 CONCAT14(in_stack_fffffffffffff6dc,
                                                          in_stack_fffffffffffff6d8)))),
             (type *)0xeecf0c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
              );
    std::__cxx11::string::~string(local_2f8);
    testing::Message::~Message((Message *)0xeecfe1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed078);
  HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
              in_stack_fffffffffffff744);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
                    ,(key_type *)
                     CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))));
  std::__cxx11::string::~string(local_318);
  uVar6 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff6e3,
                                                  CONCAT12(in_stack_fffffffffffff6e2,
                                                           CONCAT11(in_stack_fffffffffffff6e1,
                                                                    in_stack_fffffffffffff6e0)))))))
                       ,(BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6df,
                                    CONCAT16(in_stack_fffffffffffff6de,
                                             CONCAT15(in_stack_fffffffffffff6dd,
                                                      CONCAT14(in_stack_fffffffffffff6dc,
                                                               in_stack_fffffffffffff6d8)))));
  local_329 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff6e2,
                                                  CONCAT11(in_stack_fffffffffffff6e1,
                                                           in_stack_fffffffffffff6e0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeed0f6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff6e2,
                                                  CONCAT11(in_stack_fffffffffffff6e1,
                                                           in_stack_fffffffffffff6e0))))))));
    std::__cxx11::string::~string(local_360);
    testing::Message::~Message((Message *)0xeed1f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed285);
  uVar7 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(in_stack_fffffffffffff6e2,
                                                            CONCAT11(in_stack_fffffffffffff6e1,
                                                                     in_stack_fffffffffffff6e0))))))
                                  ),
                       (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,
                                   CONCAT16(in_stack_fffffffffffff6de,
                                            CONCAT15(in_stack_fffffffffffff6dd,
                                                     CONCAT14(in_stack_fffffffffffff6dc,
                                                              in_stack_fffffffffffff6d8)))));
  local_371 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff6e1,
                                                                 in_stack_fffffffffffff6e0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeed2c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff6e1,
                                                                 in_stack_fffffffffffff6e0))))))));
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0xeed39d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed431);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff6e1,
                                                                 in_stack_fffffffffffff6e0))))))),
           CONCAT17(in_stack_fffffffffffff6df,
                    CONCAT16(in_stack_fffffffffffff6de,
                             CONCAT15(in_stack_fffffffffffff6dd,
                                      CONCAT14(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8))
                            )));
  uVar8 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffff6e1
                                                                           ,
                                                  in_stack_fffffffffffff6e0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,
                                   CONCAT16(in_stack_fffffffffffff6de,
                                            CONCAT15(in_stack_fffffffffffff6dd,
                                                     CONCAT14(in_stack_fffffffffffff6dc,
                                                              in_stack_fffffffffffff6d8)))));
  local_3b9 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff6e0))))
                                                  ))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeed486);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff6e0))))
                                                  ))));
    std::__cxx11::string::~string(local_3f0);
    testing::Message::~Message((Message *)0xeed55b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed5f2);
  Hasher::Hasher(&local_3fc,1);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_410,2,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_00,(size_type)count,(hasher *)CONCAT44(i_00,in_stack_fffffffffffff6f0),
             (key_equal *)in_RDI,
             (allocator_type *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff6e0))))
                                                  ))));
  uVar9 = google::
          BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(uVar7,CONCAT11(uVar8,
                                                  in_stack_fffffffffffff6e0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,
                                   CONCAT16(in_stack_fffffffffffff6de,
                                            CONCAT15(in_stack_fffffffffffff6dd,
                                                     CONCAT14(in_stack_fffffffffffff6dc,
                                                              in_stack_fffffffffffff6d8)))));
  local_4d9 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff6df,
                              CONCAT16(in_stack_fffffffffffff6de,
                                       CONCAT15(in_stack_fffffffffffff6dd,
                                                CONCAT14(in_stack_fffffffffffff6dc,
                                                         in_stack_fffffffffffff6d8)))),
             (type *)0xeed686);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_510);
    testing::Message::~Message((Message *)0xeed78d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed821);
  uVar10 = google::
           BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6df,
                                    CONCAT16(in_stack_fffffffffffff6de,
                                             CONCAT15(in_stack_fffffffffffff6dd,
                                                      CONCAT14(in_stack_fffffffffffff6dc,
                                                               in_stack_fffffffffffff6d8)))));
  local_521 = ~uVar10 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffff6de,
                                              CONCAT15(in_stack_fffffffffffff6dd,
                                                       CONCAT14(in_stack_fffffffffffff6dc,
                                                                in_stack_fffffffffffff6d8)))),
             (type *)0xeed864);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_558);
    testing::Message::~Message((Message *)0xeed939);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeed9d0);
  HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  uVar11 = google::
           BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffff6de,
                                                    CONCAT15(in_stack_fffffffffffff6dd,
                                                             CONCAT14(in_stack_fffffffffffff6dc,
                                                                      in_stack_fffffffffffff6d8)))))
  ;
  local_601 = uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffff6dd,
                                                              CONCAT14(in_stack_fffffffffffff6dc,
                                                                       in_stack_fffffffffffff6d8))))
             ,(type *)0xeeda56);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_600);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_638);
    testing::Message::~Message((Message *)0xeedb51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeedbe5);
  uVar12 = google::
           BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffff6dd,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff6dc,
                                                  in_stack_fffffffffffff6d8)))));
  local_649 = ~uVar12 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(
                                                  in_stack_fffffffffffff6dc,
                                                  in_stack_fffffffffffff6d8)))),(type *)0xeedc28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_680);
    testing::Message::~Message((Message *)0xeedcfd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeedd94);
  HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  uVar13 = google::
           BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(
                                                  in_stack_fffffffffffff6dc,
                                                  in_stack_fffffffffffff6d8)))));
  local_729 = uVar13;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,
                                                  in_stack_fffffffffffff6d8)))),(type *)0xeede1a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_728);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)count >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_760);
    testing::Message::~Message((Message *)0xeedf15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeedfac);
  for (local_764 = 3; local_764 < 0x7d1; local_764 = local_764 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  }
  local_804 = 2000;
  while( true ) {
    type = (Type)((ulong)this_01 >> 0x20);
    line = (int)((ulong)count >> 0x20);
    if (local_804 < 3) break;
    HashtableTest<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    local_804 = local_804 + -1;
  }
  uVar14 = google::
           BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,
                                                  in_stack_fffffffffffff6d8)))));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,CONCAT13(uVar14
                                                  ,(int3)in_stack_fffffffffffff6d8))))),
             (type *)0xeee12b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff750);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff758._M_head_impl,in_stack_fffffffffffff750,
               (char *)CONCAT17(uVar14,in_stack_fffffffffffff748),
               (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)this_00,line,
               (char *)CONCAT44(i_00,in_stack_fffffffffffff6f0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff760,(Message *)in_stack_fffffffffffff758._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_8e8);
    testing::Message::~Message((Message *)0xeee1cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeee252);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xeee25f);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_410);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xeee279);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xeee286);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}